

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IStreamingReporter * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  LazyStat<Catch::TestRunInfo> *pLVar1;
  StreamingReporterBase *this_00;
  
  this_00 = (StreamingReporterBase *)operator_new(0x228);
  StreamingReporterBase::StreamingReporterBase(this_00,config);
  (this_00->super_SharedImpl<Catch::IStreamingReporter>).super_IStreamingReporter.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__XmlReporter_001aeef8;
  this_00[1].super_SharedImpl<Catch::IStreamingReporter>.super_IStreamingReporter.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  *(undefined2 *)&this_00[1].super_SharedImpl<Catch::IStreamingReporter>.m_rc = 0;
  this_00[1].m_config.m_p = (IConfig *)0x0;
  this_00[1].stream = (ostream *)0x0;
  this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.nullableValue = (TestRunInfo *)0x0;
  *(char **)this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.storage =
       this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.storage + 0x10;
  pLVar1 = &this_00[1].currentTestRunInfo;
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[8] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[9] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[10] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0xb] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0xc] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0xd] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0xe] = '\0';
  (pLVar1->super_Option<Catch::TestRunInfo>).storage[0xf] = '\0';
  this_00[1].currentTestRunInfo.super_Option<Catch::TestRunInfo>.storage[0x10] = '\0';
  *(undefined8 **)&this_00[1].currentTestRunInfo.used = &std::cout;
  *(undefined4 *)&this_00[1].currentGroupInfo.super_Option<Catch::GroupInfo>.nullableValue = 0;
  (this_00->m_reporterPrefs).shouldRedirectStdOut = true;
  return (IStreamingReporter *)this_00;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new T( config );
            }